

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O3

int maybe_start_packet(vorb *f)

{
  uint8 uVar1;
  int iVar2;
  
  if (f->next_seg != -1) {
LAB_00160bb5:
    iVar2 = start_packet(f);
    return iVar2;
  }
  uVar1 = get8(f);
  if (f->eof == 0) {
    if ((((uVar1 == 'O') && (uVar1 = get8(f), uVar1 == 'g')) && (uVar1 = get8(f), uVar1 == 'g')) &&
       (uVar1 = get8(f), uVar1 == 'S')) {
      iVar2 = start_page_no_capturepattern(f);
      if (iVar2 == 0) {
        return 0;
      }
      if ((f->page_flag & 1) != 0) {
        f->last_seg = 0;
        f->bytes_in_seg = '\0';
        f->error = VORBIS_continued_packet_flag_invalid;
        return 0;
      }
      goto LAB_00160bb5;
    }
    f->error = VORBIS_missing_capture_pattern;
  }
  return 0;
}

Assistant:

static int maybe_start_packet(vorb *f)
{
   if (f->next_seg == -1) {
      int x = get8(f);
      if (f->eof) return FALSE; // EOF at page boundary is not an error!
      if (0x4f != x      ) return error(f, VORBIS_missing_capture_pattern);
      if (0x67 != get8(f)) return error(f, VORBIS_missing_capture_pattern);
      if (0x67 != get8(f)) return error(f, VORBIS_missing_capture_pattern);
      if (0x53 != get8(f)) return error(f, VORBIS_missing_capture_pattern);
      if (!start_page_no_capturepattern(f)) return FALSE;
      if (f->page_flag & PAGEFLAG_continued_packet) {
         // set up enough state that we can read this packet if we want,
         // e.g. during recovery
         f->last_seg = FALSE;
         f->bytes_in_seg = 0;
         return error(f, VORBIS_continued_packet_flag_invalid);
      }
   }
   return start_packet(f);
}